

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

opj_j2k_t * j2k_create_decompress(opj_common_ptr cinfo)

{
  opj_j2k_t *__ptr;
  opj_tcp_t *poVar1;
  
  __ptr = (opj_j2k_t *)calloc(1,0x78);
  if (__ptr != (opj_j2k_t *)0x0) {
    poVar1 = (opj_tcp_t *)calloc(1,0x15e8);
    __ptr->default_tcp = poVar1;
    if (poVar1 != (opj_tcp_t *)0x0) {
      __ptr->cinfo = cinfo;
      __ptr->tile_data = (uchar **)0x0;
      return __ptr;
    }
    free(__ptr);
  }
  return (opj_j2k_t *)0x0;
}

Assistant:

opj_j2k_t* j2k_create_decompress(opj_common_ptr cinfo) {
	opj_j2k_t *j2k = (opj_j2k_t*) opj_calloc(1, sizeof(opj_j2k_t));
	if(!j2k)
		return NULL;

	j2k->default_tcp = (opj_tcp_t*) opj_calloc(1, sizeof(opj_tcp_t));
	if(!j2k->default_tcp) {
		opj_free(j2k);
		return NULL;
	}

	j2k->cinfo = cinfo;
	j2k->tile_data = NULL;

	return j2k;
}